

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expected-main.t.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  tests *__x;
  vector<lest::test,_std::allocator<lest::test>_> local_30;
  char **local_18;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  local_18 = argv;
  argv_local._0_4_ = argc;
  __x = specification();
  std::vector<lest::test,_std::allocator<lest::test>_>::vector(&local_30,__x);
  argv_local._4_4_ = lest::run(&local_30,(int)argv_local,local_18,(ostream *)&std::cout);
  std::vector<lest::test,_std::allocator<lest::test>_>::~vector(&local_30);
  return argv_local._4_4_;
}

Assistant:

int main( int argc, char * argv[] )
{
    return lest::run( specification(), argc, argv );
}